

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::Random::items<wasm::Type>
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,Random *this,
          FeatureOptions<wasm::Type> *picker)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> local_70;
  const_iterator local_68;
  uint32_t local_4c;
  reference local_48;
  pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *item;
  iterator __end0;
  iterator __begin0;
  map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
  *__range2;
  FeatureOptions<wasm::Type> *picker_local;
  Random *this_local;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *matches;
  
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(__return_storage_ptr__);
  __end0 = std::
           map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
           ::begin(&picker->options);
  item = (pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
         std::
         map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
         ::end(&picker->options);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&item), bVar1) {
    local_48 = std::
               _Rb_tree_iterator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
               ::operator*(&__end0);
    local_4c = (local_48->first).features;
    bVar1 = FeatureSet::has(&this->features,(FeatureSet)local_4c);
    if (bVar1) {
      sVar2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(__return_storage_ptr__);
      sVar3 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(&local_48->second);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
                (__return_storage_ptr__,sVar2 + sVar3);
      local_70._M_current =
           (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(__return_storage_ptr__)
      ;
      __gnu_cxx::
      __normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>::
      __normal_iterator<wasm::Type*>
                ((__normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>
                  *)&local_68,&local_70);
      __first = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(&local_48->second);
      __last = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(&local_48->second);
      std::vector<wasm::Type,std::allocator<wasm::Type>>::
      insert<__gnu_cxx::__normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,local_68,
                 (__normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                  )__last._M_current);
    }
    std::
    _Rb_tree_iterator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> items(FeatureOptions<T>& picker) {
    std::vector<T> matches;
    for (const auto& item : picker.options) {
      if (features.has(item.first)) {
        matches.reserve(matches.size() + item.second.size());
        matches.insert(matches.end(), item.second.begin(), item.second.end());
      }
    }
    return matches;
  }